

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<const_phmap::parallel_node_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_&>
::MatchAndExplain(UnorderedElementsAreMatcherImpl<const_phmap::parallel_node_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_&>
                  *this,parallel_node_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>
                        *container,MatchResultListener *listener)

{
  const_iterator elem_first;
  const_iterator elem_last;
  bool bVar1;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  *this_00;
  bool local_e2;
  const_iterator local_d8;
  const_iterator local_98;
  undefined1 local_68 [8];
  MatchMatrix matrix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_printouts;
  StlContainerReference stl_container;
  MatchResultListener *listener_local;
  parallel_node_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>
  *container_local;
  UnorderedElementsAreMatcherImpl<const_phmap::parallel_node_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_&>
  *this_local;
  
  this_00 = (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
             *)StlContainerView<phmap::parallel_node_hash_map<int,_phmap::priv::NonStandardLayout,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>,_4UL,_phmap::NullMutex>_>
               ::ConstReference(container);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::begin(&local_98,this_00);
  phmap::priv::
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::NonStandardLayout>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_int,_phmap::priv::NonStandardLayout>_>_>
  ::end(&local_d8,this_00);
  elem_first.iter_.inner_end_ = local_98.iter_.inner_end_;
  elem_first.iter_.inner_ = local_98.iter_.inner_;
  elem_first.iter_.it_.ctrl_ = local_98.iter_.it_.ctrl_;
  elem_first.iter_.it_.field_1.slot_ = local_98.iter_.it_.field_1.slot_;
  elem_first.iter_.it_end_.ctrl_ = local_98.iter_.it_end_.ctrl_;
  elem_first.iter_.it_end_.field_1.slot_ = local_98.iter_.it_end_.field_1.slot_;
  elem_last.iter_.inner_end_ = local_d8.iter_.inner_end_;
  elem_last.iter_.inner_ = local_d8.iter_.inner_;
  elem_last.iter_.it_.ctrl_ = local_d8.iter_.it_.ctrl_;
  elem_last.iter_.it_.field_1.slot_ = local_d8.iter_.it_.field_1.slot_;
  elem_last.iter_.it_end_.ctrl_ = local_d8.iter_.it_end_.ctrl_;
  elem_last.iter_.it_end_.field_1.slot_ = local_d8.iter_.it_end_.field_1.slot_;
  UnorderedElementsAreMatcherImpl<phmap::parallel_node_hash_map<int,phmap::priv::NonStandardLayout,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>,4ul,phmap::NullMutex>const&>
  ::
  AnalyzeElements<phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<int,phmap::priv::NonStandardLayout>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>>::const_iterator>
            ((MatchMatrix *)local_68,
             (UnorderedElementsAreMatcherImpl<phmap::parallel_node_hash_map<int,phmap::priv::NonStandardLayout,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,phmap::priv::NonStandardLayout>>,4ul,phmap::NullMutex>const&>
              *)this,elem_first,elem_last,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
             listener);
  bVar1 = UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
                    (&this->super_UnorderedElementsAreMatcherImplBase,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         field_0x10,(MatchMatrix *)local_68,listener);
  local_e2 = false;
  if (bVar1) {
    local_e2 = UnorderedElementsAreMatcherImplBase::FindPairing
                         (&this->super_UnorderedElementsAreMatcherImplBase,(MatchMatrix *)local_68,
                          listener);
  }
  MatchMatrix::~MatchMatrix((MatchMatrix *)local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&matrix.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  return local_e2;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    StlContainerReference stl_container = View::ConstReference(container);
    ::std::vector<std::string> element_printouts;
    MatchMatrix matrix =
        AnalyzeElements(stl_container.begin(), stl_container.end(),
                        &element_printouts, listener);

    return VerifyMatchMatrix(element_printouts, matrix, listener) &&
           FindPairing(matrix, listener);
  }